

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

void duckdb::StringStats::Deserialize(Deserializer *deserializer,BaseStatistics *base)

{
  Deserializer::ReadProperty(deserializer,200,"min",(data_ptr_t)&base->stats_union,8);
  Deserializer::ReadProperty(deserializer,0xc9,"max",(base->stats_union).string_data.max,8);
  Deserializer::ReadProperty<bool>
            (deserializer,0xca,"has_unicode",&(base->stats_union).string_data.has_unicode);
  Deserializer::ReadProperty<bool>
            (deserializer,0xcb,"has_max_string_length",
             &(base->stats_union).string_data.has_max_string_length);
  Deserializer::ReadProperty<unsigned_int>
            (deserializer,0xcc,"max_string_length",
             &(base->stats_union).string_data.max_string_length);
  return;
}

Assistant:

void StringStats::Deserialize(Deserializer &deserializer, BaseStatistics &base) {
	auto &string_data = StringStats::GetDataUnsafe(base);
	deserializer.ReadProperty(200, "min", string_data.min, StringStatsData::MAX_STRING_MINMAX_SIZE);
	deserializer.ReadProperty(201, "max", string_data.max, StringStatsData::MAX_STRING_MINMAX_SIZE);
	deserializer.ReadProperty(202, "has_unicode", string_data.has_unicode);
	deserializer.ReadProperty(203, "has_max_string_length", string_data.has_max_string_length);
	deserializer.ReadProperty(204, "max_string_length", string_data.max_string_length);
}